

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall Assimp::FBX::FBXConverter::ConvertAnimations(FBXConverter *this)

{
  FileGlobalSettings *pFVar1;
  pointer ppAVar2;
  FrameRate fp;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *pvVar3;
  pointer ppAVar4;
  float fVar5;
  double dVar6;
  
  pFVar1 = (this->doc->globals)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
  if (pFVar1 != (FileGlobalSettings *)0x0) {
    fp = FileGlobalSettings::TimeMode(pFVar1);
    pFVar1 = (this->doc->globals)._M_t.
             super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
    if (pFVar1 != (FileGlobalSettings *)0x0) {
      fVar5 = FileGlobalSettings::CustomFrameRate(pFVar1);
      dVar6 = FrameRateToDouble(fp,(double)fVar5);
      this->anim_fps = dVar6;
      pvVar3 = Document::AnimationStacks(this->doc);
      ppAVar2 = (pvVar3->
                super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppAVar4 = (pvVar3->
                     super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppAVar4 != ppAVar2;
          ppAVar4 = ppAVar4 + 1) {
        ConvertAnimationStack(this,*ppAVar4);
      }
      return;
    }
  }
  __assert_fail("globals.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                ,0x44d,"const FileGlobalSettings &Assimp::FBX::Document::GlobalSettings() const");
}

Assistant:

void FBXConverter::ConvertAnimations()
        {
            // first of all determine framerate
            const FileGlobalSettings::FrameRate fps = doc.GlobalSettings().TimeMode();
            const float custom = doc.GlobalSettings().CustomFrameRate();
            anim_fps = FrameRateToDouble(fps, custom);

            const std::vector<const AnimationStack*>& animations = doc.AnimationStacks();
            for (const AnimationStack* stack : animations) {
                ConvertAnimationStack(*stack);
            }
        }